

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtrState<vkt::Draw::Image,_de::DefaultDeleter<vkt::Draw::Image>_>::deletePtr
          (SharedPtrState<vkt::Draw::Image,_de::DefaultDeleter<vkt::Draw::Image>_> *this)

{
  SharedPtrState<vkt::Draw::Image,_de::DefaultDeleter<vkt::Draw::Image>_> *this_local;
  
  DefaultDeleter<vkt::Draw::Image>::operator()
            ((DefaultDeleter<vkt::Draw::Image> *)&this->field_0x18,this->m_ptr);
  this->m_ptr = (Image *)0x0;
  return;
}

Assistant:

virtual void deletePtr (void) throw()
	{
		m_deleter(m_ptr);
		m_ptr = DE_NULL;
	}